

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O2

void __thiscall QWidgetTextControl::setCursorWidth(QWidgetTextControl *this,int width)

{
  QWidgetTextControlPrivate *this_00;
  long lVar1;
  QStyle *pQVar2;
  QObject *this_01;
  long lVar3;
  long in_FS_OFFSET;
  QVariant QStack_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidgetTextControlPrivate **)(this + 8);
  if (width == -1) {
    pQVar2 = QApplication::style();
    lVar1 = *(long *)(*(long *)(this + 8) + 0x10);
    if (lVar1 == 0) {
      lVar3 = 0;
    }
    else {
      lVar3 = 0;
      if ((*(byte *)(*(long *)(lVar1 + 8) + 0x30) & 1) != 0) {
        lVar3 = lVar1;
      }
    }
    width = (**(code **)(*(long *)pQVar2 + 0xe0))(pQVar2,0x52,0,lVar3);
  }
  this_01 = (QObject *)QTextDocument::documentLayout();
  ::QVariant::QVariant(&QStack_48,width);
  QObject::setProperty(this_01,"cursorWidth",&QStack_48);
  ::QVariant::~QVariant(&QStack_48);
  QWidgetTextControlPrivate::repaintCursor(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetTextControl::setCursorWidth(int width)
{
    Q_D(QWidgetTextControl);
    if (width == -1)
        width = QApplication::style()->pixelMetric(QStyle::PM_TextCursorWidth, nullptr, qobject_cast<QWidget *>(parent()));
    d->doc->documentLayout()->setProperty("cursorWidth", width);
    d->repaintCursor();
}